

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  char c;
  Mode MVar1;
  size_t i;
  size_t i_00;
  
  i_00 = 0;
  do {
    c = (arg->_M_dataplus)._M_p[i_00];
    if (c == '\"') {
      this->inQuotes = (bool)(this->inQuotes ^ 1);
    }
    MVar1 = handleMode(this,i_00,c,arg,tokens);
    this->mode = MVar1;
    i_00 = i_00 + 1;
  } while (i_00 <= arg->_M_string_length);
  return;
}

Assistant:

void parseIntoTokens( std::string const& arg, std::vector<Token>& tokens ) {
            for( std::size_t i = 0; i <= arg.size(); ++i ) {
                char c = arg[i];
                if( c == '"' )
                    inQuotes = !inQuotes;
                mode = handleMode( i, c, arg, tokens );
            }
        }